

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo.c
# Opt level: O1

int fits_calc_binning(fitsfile *fptr,int naxis,char (*colname) [71],double *minin,double *maxin,
                     double *binsizein,char (*minname) [71],char (*maxname) [71],
                     char (*binname) [71],int *colnum,long *haxes,float *amin,float *amax,
                     float *binsize,int *status)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  double binsized [4];
  double amaxd [4];
  double amind [4];
  double local_78 [4];
  double local_58 [4];
  double local_38 [5];
  
  fits_calc_binningde(fptr,naxis,colname,(char **)0x0,minin,maxin,binsizein,minname,maxname,binname,
                      colnum,(int *)0x0,haxes,local_38,local_58,local_78,(long *)0x0,status);
  iVar1 = *status;
  if (0 < naxis && iVar1 == 0) {
    uVar2 = 4;
    if (naxis < 4) {
      uVar2 = (ulong)(uint)naxis;
    }
    uVar3 = 0;
    do {
      amin[uVar3] = (float)local_38[uVar3];
      amax[uVar3] = (float)local_58[uVar3];
      binsize[uVar3] = (float)local_78[uVar3];
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  return iVar1;
}

Assistant:

int fits_calc_binning(
      fitsfile *fptr,  /* IO - pointer to table to be binned      ;       */
      int naxis,       /* I - number of axes/columns in the binned image  */
      char colname[4][FLEN_VALUE],   /* I - optional column names         */
      double *minin,     /* I - optional lower bound value for each axis  */
      double *maxin,     /* I - optional upper bound value, for each axis */
      double *binsizein, /* I - optional bin size along each axis         */
      char minname[4][FLEN_VALUE], /* I - optional keywords for min       */
      char maxname[4][FLEN_VALUE], /* I - optional keywords for max       */
      char binname[4][FLEN_VALUE], /* I - optional keywords for binsize   */

    /* The returned parameters for each axis of the n-dimensional histogram are */

      int *colnum,     /* O - column numbers, to be binned */
      long *haxes,     /* O - number of bins in each histogram axis */
      float *amin,     /* O - lower bound of the histogram axes */
      float *amax,     /* O - upper bound of the histogram axes */
      float *binsize,  /* O - width of histogram bins/pixels on each axis */
      int *status)
{
  double amind[4], amaxd[4], binsized[4];

  fits_calc_binningd(fptr, naxis, colname, minin, maxin, binsizein, minname, maxname, binname,
		     colnum, haxes, amind, amaxd, binsized, status);

  /* Copy double precision values into single precision */
  if (*status == 0) {
    int i, naxis1 = 4;
    if (naxis < naxis1) naxis1 = naxis;
    for (i=0; i<naxis1; i++) {
      amin[i] = (float) amind[i];
      amax[i] = (float) amaxd[i];
      binsize[i] = (float) binsized[i];
    }
  }

  return (*status);
}